

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void handle_struct_assign(Vm *vm)

{
  Compiler *pCVar1;
  TokenType TVar2;
  CallFrame *pCVar3;
  char *pcVar4;
  size_t sVar5;
  uint32_t uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint8_t uVar9;
  Token local_38;
  
  pCVar1 = &vm->compiler;
  TVar2 = (vm->compiler).token.type;
  if (TVar2 == TOKEN_PLUS_PLUS) {
    TVar2 = (pCVar1->token).type;
    uVar8 = *(undefined4 *)&(pCVar1->token).field_0x4;
    pcVar4 = (vm->compiler).token.start;
    uVar6 = (vm->compiler).token.line;
    uVar7 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
    (vm->compiler).previous.length = (vm->compiler).token.length;
    (vm->compiler).previous.line = uVar6;
    *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar7;
    (vm->compiler).previous.type = TVar2;
    *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar8;
    (vm->compiler).previous.start = pcVar4;
    uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x4;
    pcVar4 = (vm->compiler).next.start;
    sVar5 = (vm->compiler).next.length;
    uVar6 = (vm->compiler).next.line;
    uVar8 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
    (pCVar1->token).type = (vm->compiler).next.type;
    *(undefined4 *)&(pCVar1->token).field_0x4 = uVar7;
    (vm->compiler).token.start = pcVar4;
    (vm->compiler).token.length = sVar5;
    (vm->compiler).token.line = uVar6;
    *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar8;
    scan_token(&local_38,&(vm->compiler).scanner);
    (vm->compiler).next.length = local_38.length;
    (vm->compiler).next.line = local_38.line;
    *(undefined4 *)&(vm->compiler).next.field_0x1c = local_38._28_4_;
    (vm->compiler).next.type = local_38.type;
    *(undefined4 *)&(vm->compiler).next.field_0x4 = local_38._4_4_;
    (vm->compiler).next.start = local_38.start;
    write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'%');
    write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x15');
    pCVar3 = (vm->frames).frame_pointers[vm->frame_count - 1];
    uVar9 = '\x04';
  }
  else {
    if (TVar2 != TOKEN_MINUS_MINUS) {
      if (TVar2 == TOKEN_EQUALS) {
        TVar2 = (pCVar1->token).type;
        uVar8 = *(undefined4 *)&(pCVar1->token).field_0x4;
        pcVar4 = (vm->compiler).token.start;
        uVar6 = (vm->compiler).token.line;
        uVar7 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
        (vm->compiler).previous.length = (vm->compiler).token.length;
        (vm->compiler).previous.line = uVar6;
        *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar7;
        (vm->compiler).previous.type = TVar2;
        *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar8;
        (vm->compiler).previous.start = pcVar4;
        uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x4;
        pcVar4 = (vm->compiler).next.start;
        sVar5 = (vm->compiler).next.length;
        uVar6 = (vm->compiler).next.line;
        uVar8 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
        (pCVar1->token).type = (vm->compiler).next.type;
        *(undefined4 *)&(pCVar1->token).field_0x4 = uVar7;
        (vm->compiler).token.start = pcVar4;
        (vm->compiler).token.length = sVar5;
        (vm->compiler).token.line = uVar6;
        *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar8;
        scan_token(&local_38,&(vm->compiler).scanner);
        (vm->compiler).next.length = local_38.length;
        (vm->compiler).next.line = local_38.line;
        *(undefined4 *)&(vm->compiler).next.field_0x1c = local_38._28_4_;
        (vm->compiler).next.type = local_38.type;
        *(undefined4 *)&(vm->compiler).next.field_0x4 = local_38._4_4_;
        (vm->compiler).next.start = local_38.start;
        expr(vm);
        uVar9 = '#';
      }
      else {
        uVar9 = '$';
      }
      goto LAB_001072ac;
    }
    TVar2 = (pCVar1->token).type;
    uVar8 = *(undefined4 *)&(pCVar1->token).field_0x4;
    pcVar4 = (vm->compiler).token.start;
    uVar6 = (vm->compiler).token.line;
    uVar7 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
    (vm->compiler).previous.length = (vm->compiler).token.length;
    (vm->compiler).previous.line = uVar6;
    *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar7;
    (vm->compiler).previous.type = TVar2;
    *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar8;
    (vm->compiler).previous.start = pcVar4;
    uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x4;
    pcVar4 = (vm->compiler).next.start;
    sVar5 = (vm->compiler).next.length;
    uVar6 = (vm->compiler).next.line;
    uVar8 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
    (pCVar1->token).type = (vm->compiler).next.type;
    *(undefined4 *)&(pCVar1->token).field_0x4 = uVar7;
    (vm->compiler).token.start = pcVar4;
    (vm->compiler).token.length = sVar5;
    (vm->compiler).token.line = uVar6;
    *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar8;
    scan_token(&local_38,&(vm->compiler).scanner);
    (vm->compiler).next.length = local_38.length;
    (vm->compiler).next.line = local_38.line;
    *(undefined4 *)&(vm->compiler).next.field_0x1c = local_38._28_4_;
    (vm->compiler).next.type = local_38.type;
    *(undefined4 *)&(vm->compiler).next.field_0x4 = local_38._4_4_;
    (vm->compiler).next.start = local_38.start;
    write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'%');
    write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x15');
    pCVar3 = (vm->frames).frame_pointers[vm->frame_count - 1];
    uVar9 = '\x05';
  }
  write_code_buffer(&pCVar3->code_buffer,uVar9);
  uVar9 = '#';
LAB_001072ac:
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,uVar9);
  return;
}

Assistant:

static void handle_struct_assign(Vm *vm) {
    switch (vm->compiler.token.type) {
        case TOKEN_EQUALS:
            advance(vm);
            expr(vm);
            emit_no_arg(vm, OP_STRUCT_SET);
            return;
        case TOKEN_PLUS_PLUS:
            advance(vm);
            emit_no_arg(vm, OP_STRUCT_PEEK);
            emit_no_arg(vm, OP_LDC_1);
            emit_no_arg(vm, OP_ADD);
            emit_no_arg(vm, OP_STRUCT_SET);
            return;
        case TOKEN_MINUS_MINUS:
            advance(vm);
            emit_no_arg(vm, OP_STRUCT_PEEK);
            emit_no_arg(vm, OP_LDC_1);
            emit_no_arg(vm, OP_SUB);
            emit_no_arg(vm, OP_STRUCT_SET);
            return;
        default:
            emit_no_arg(vm, OP_STRUCT_GET);
            break;
    }
}